

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

float_specs
fmt::v7::detail::parse_float_type_spec<fmt::v7::detail::error_handler,char>
          (basic_format_specs<char> *specs,error_handler *eh)

{
  error_handler eVar1;
  byte bVar2;
  char *in_RSI;
  error_handler *in_RDI;
  float_specs result;
  float_specs local_8;
  
  bVar2 = (byte)in_RDI[9] >> 7;
  local_8._4_4_ = (uint)bVar2 << 0x14;
  eVar1 = in_RDI[8];
  if (eVar1 == (error_handler)0x0) {
    local_8 = (float_specs)((ulong)(bVar2 != 0 || 0 < *(int *)(in_RDI + 4)) << 0x34);
    return local_8;
  }
  if (eVar1 == (error_handler)0x41) {
    local_8._4_4_ = local_8._4_4_ | 0x10000;
LAB_001ba6fa:
    local_8 = (float_specs)((ulong)(uint)local_8._4_4_ << 0x20 | 0x300000000);
  }
  else {
    if (eVar1 == (error_handler)0x45) {
      local_8._4_4_ = local_8._4_4_ | 0x10000;
LAB_001ba631:
      local_8 = (float_specs)
                ((ulong)(local_8._4_4_ & 0xffefffff | 1 |
                        (uint)((uint)local_8._4_4_ >> 0x14 != 0 || *(int *)(in_RDI + 4) != 0) <<
                        0x14) << 0x20);
      return local_8;
    }
    if (eVar1 == (error_handler)0x46) {
      local_8._4_4_ = local_8._4_4_ | 0x10000;
LAB_001ba697:
      local_8 = (float_specs)
                ((ulong)(local_8._4_4_ & 0xffefffff | 2 |
                        (uint)((uint)local_8._4_4_ >> 0x14 != 0 || *(int *)(in_RDI + 4) != 0) <<
                        0x14) << 0x20);
      return local_8;
    }
    if (eVar1 == (error_handler)0x47) {
      local_8._4_4_ = local_8._4_4_ | 0x10000;
    }
    else {
      if (eVar1 == (error_handler)0x4c) {
        local_8 = (float_specs)((ulong)bVar2 << 0x34 | 0x2000000000000);
        return local_8;
      }
      if (eVar1 == (error_handler)0x61) goto LAB_001ba6fa;
      if (eVar1 == (error_handler)0x65) goto LAB_001ba631;
      if (eVar1 == (error_handler)0x66) goto LAB_001ba697;
      if (eVar1 != (error_handler)0x67) {
        error_handler::on_error(in_RDI,in_RSI);
      }
    }
    local_8 = (float_specs)((ulong)(uint)local_8._4_4_ << 0x20);
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR float_specs parse_float_type_spec(
    const basic_format_specs<Char>& specs, ErrorHandler&& eh = {}) {
  auto result = float_specs();
  result.showpoint = specs.alt;
  switch (specs.type) {
  case 0:
    result.format = float_format::general;
    result.showpoint |= specs.precision > 0;
    break;
  case 'G':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'g':
    result.format = float_format::general;
    break;
  case 'E':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'e':
    result.format = float_format::exp;
    result.showpoint |= specs.precision != 0;
    break;
  case 'F':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'f':
    result.format = float_format::fixed;
    result.showpoint |= specs.precision != 0;
    break;
  case 'A':
    result.upper = true;
    FMT_FALLTHROUGH;
  case 'a':
    result.format = float_format::hex;
    break;
#ifdef FMT_DEPRECATED_N_SPECIFIER
  case 'n':
#endif
  case 'L':
    result.locale = true;
    break;
  default:
    eh.on_error("invalid type specifier");
    break;
  }
  return result;
}